

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_value * jx9VmReserveMemObj(jx9_vm *pVm,sxu32 *pIdx)

{
  void *pvVar1;
  uint *puVar2;
  jx9_value *pObj;
  sxu32 nIdx;
  sxu32 local_1c;
  
  local_1c = 0xffffffff;
  puVar2 = (uint *)SySetPop(&pVm->aFreeObj);
  if ((puVar2 != (uint *)0x0) && (local_1c = *puVar2, local_1c < (pVm->aMemObj).nUsed)) {
    pvVar1 = (pVm->aMemObj).pBase;
    if (pvVar1 != (void *)0x0) {
      pObj = (jx9_value *)((long)pvVar1 + (ulong)((pVm->aMemObj).eSize * local_1c));
      goto LAB_00119487;
    }
  }
  pObj = VmReserveMemObj(pVm,&local_1c);
  if (pObj == (jx9_value *)0x0) {
    return (jx9_value *)0x0;
  }
LAB_00119487:
  jx9MemObjInit(pVm,pObj);
  if (pIdx != (sxu32 *)0x0) {
    *pIdx = local_1c;
  }
  pObj->nIdx = local_1c;
  return pObj;
}

Assistant:

JX9_PRIVATE jx9_value * jx9VmReserveMemObj(jx9_vm *pVm,sxu32 *pIdx)
{
	jx9_value *pObj = 0;
	VmSlot *pSlot;
	sxu32 nIdx;
	/* Check for a free slot */
	nIdx = SXU32_HIGH; /* cc warning */
	pSlot = (VmSlot *)SySetPop(&pVm->aFreeObj);
	if( pSlot ){
		pObj = (jx9_value *)SySetAt(&pVm->aMemObj, pSlot->nIdx);
		nIdx = pSlot->nIdx;
	}
	if( pObj == 0 ){
		/* Reserve a new memory object */
		pObj = VmReserveMemObj(&(*pVm), &nIdx);
		if( pObj == 0 ){
			return 0;
		}
	}
	/* Set a null default value */
	jx9MemObjInit(&(*pVm), pObj);
	if( pIdx ){
		*pIdx = nIdx;
	}
	pObj->nIdx = nIdx;
	return pObj;
}